

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRST.cxx
# Opt level: O0

void reportLine(ostream *os,bool ret,string *line,bool eol)

{
  ostream *poVar1;
  char *pcVar2;
  bool eol_local;
  string *line_local;
  bool ret_local;
  ostream *os_local;
  
  if (ret) {
    poVar1 = std::operator<<(os,"\"");
    poVar1 = std::operator<<(poVar1,(string *)line);
    poVar1 = std::operator<<(poVar1,"\" (");
    pcVar2 = "without EOL";
    if (eol) {
      pcVar2 = "with EOL";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,")");
  }
  else {
    std::operator<<(os,"EOF");
  }
  return;
}

Assistant:

static void reportLine(std::ostream& os, bool ret, std::string const& line,
                       bool eol)
{
  if (ret) {
    os << "\"" << line << "\" (" << (eol ? "with EOL" : "without EOL") << ")";
  } else {
    os << "EOF";
  }
}